

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

void __thiscall
QFSFileEnginePrivate::QFSFileEnginePrivate(QFSFileEnginePrivate *this,QAbstractFileEngine *q)

{
  EVP_PKEY_CTX *in_RSI;
  QFSFileEnginePrivate *in_RDI;
  QAbstractFileEngine *in_stack_ffffffffffffffc8;
  
  QAbstractFileEnginePrivate::QAbstractFileEnginePrivate
            (&in_RDI->super_QAbstractFileEnginePrivate,in_stack_ffffffffffffffc8);
  ((DataPointer *)&(in_RDI->super_QAbstractFileEnginePrivate)._vptr_QAbstractFileEnginePrivate)->d =
       (Data *)&PTR__QFSFileEnginePrivate_00be2d88;
  QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)in_RDI);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags((QFlags<QIODeviceBase::OpenModeFlag> *)0x2bbb33);
  QFileSystemMetaData::QFileSystemMetaData((QFileSystemMetaData *)in_RDI);
  QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::QHash(&in_RDI->maps);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

QFSFileEnginePrivate::QFSFileEnginePrivate(QAbstractFileEngine *q)
    : QAbstractFileEnginePrivate(q)
{
    init();
}